

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::DrawCallBatchingTests::init(DrawCallBatchingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  uint uVar3;
  long *name;
  long **name_00;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  undefined4 uVar8;
  deUint32 seed;
  long *plVar9;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar10;
  ostream *poVar11;
  long **pplVar12;
  long lVar13;
  undefined8 in_RCX;
  long *plVar14;
  undefined8 uVar15;
  ulong uVar16;
  bool bVar17;
  char *pcVar18;
  ulong uVar19;
  ulong in_R10;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8 [2];
  long local_2c8 [2];
  TestNode *local_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  uint local_290;
  uint local_28c;
  int local_288;
  int local_284;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  TestNode *local_260;
  TestNode *local_258;
  TestNode *local_250;
  uint local_248;
  uint local_244;
  uint local_240;
  uint local_23c;
  uint local_238;
  undefined4 local_234;
  char *local_230;
  ulong local_228;
  long local_220;
  ulong local_218;
  ulong local_210;
  char *local_208;
  TestNode *local_200;
  TestNode *local_1f8;
  long local_1f0;
  char *local_1e8;
  long local_1e0;
  char *local_1d8;
  Context *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  long **local_1a8;
  long *local_1a0;
  long *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ios_base local_138 [264];
  
  uVar16 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  local_228 = 0;
  local_258 = (TestNode *)this;
  do {
    local_230 = "draw_arrays";
    if ((local_228 & 1) != 0) {
      local_230 = "draw_elements";
    }
    uVar19 = 0;
    in_R10 = CONCAT71((int7)(in_R10 >> 8),1);
    do {
      bVar5 = ~(byte)uVar19 | (byte)local_228;
      iVar7 = (int)CONCAT71((int7)(uVar19 >> 8),bVar5);
      if ((bVar5 & 1) == 0) break;
      local_208 = "";
      if ((uVar19 & 1) != 0) {
        local_208 = "buffer_";
      }
      bVar5 = (byte)local_228 & (byte)uVar19;
      local_290 = 0x65c401;
      uVar21 = 0;
      do {
        pcVar18 = "";
        bVar6 = ~(byte)(uVar21 & 0xffffffff);
        lVar13 = CONCAT71((int7)((uVar21 & 0xffffffff) >> 8),bVar6 | bVar5);
        if ((bVar6 & 1) == 0 && bVar5 == 0) break;
        local_248 = (uint)in_R10;
        local_28c = (uint)uVar19;
        local_244 = (uint)uVar16;
        if ((uVar21 & 1) != 0) {
          pcVar18 = "dynamic_";
        }
        local_260 = (TestNode *)operator_new(0x78);
        pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        local_2d8[0] = local_2c8;
        local_234 = (int)uVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,pcVar18,pcVar18 + (uVar21 & 0xff) * 8);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_2d8);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_2e8 = *plVar14;
          lStack_2e0 = plVar9[3];
          local_2f8 = &local_2e8;
        }
        else {
          local_2e8 = *plVar14;
          local_2f8 = (long *)*plVar9;
        }
        local_2f0 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_1a8 = &local_198;
        pplVar12 = (long **)(plVar9 + 2);
        if ((long **)*plVar9 == pplVar12) {
          local_198 = *pplVar12;
          uStack_190 = (undefined4)plVar9[3];
          uStack_18c = *(undefined4 *)((long)plVar9 + 0x1c);
        }
        else {
          local_198 = *pplVar12;
          local_1a8 = (long **)*plVar9;
        }
        name_00 = local_1a8;
        local_1a0 = (long *)plVar9[1];
        *plVar9 = (long)pplVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        local_280 = &local_270;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"Test batched rendering with ","");
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_280);
        pTVar10 = local_260;
        local_2b0 = &local_2a0;
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_2a0 = *plVar14;
          lStack_298 = plVar9[3];
        }
        else {
          local_2a0 = *plVar14;
          local_2b0 = (long *)*plVar9;
        }
        local_2a8 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = local_2b0;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_260,pCVar1->m_testCtx,(char *)name_00,(char *)local_2b0);
        pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
        pTVar10[1]._vptr_TestNode = (_func_int **)pCVar1;
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0,local_2a0 + 1);
        }
        this = (DrawCallBatchingTests *)local_258;
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,(long)local_198 + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8 + 1);
        }
        if (local_2d8[0] != local_2c8) {
          operator_delete(local_2d8[0],local_2c8[0] + 1);
        }
        tcu::TestNode::addChild((TestNode *)this,pTVar10);
        uVar15 = CONCAT71((int7)((ulong)plVar9 >> 8),1);
        lVar13 = 0;
        do {
          local_240 = (uint)uVar15;
          iVar7 = (&DAT_0065c360)[lVar13];
          local_2b8 = (TestNode *)operator_new(0x78);
          pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<((ostringstream *)&local_1a8,iVar7);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_2d8);
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_2e8 = *plVar14;
            lStack_2e0 = plVar9[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *plVar14;
            local_2f8 = (long *)*plVar9;
          }
          name = local_2f8;
          local_2f0 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          local_288 = iVar7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<((ostringstream *)&local_1a8,local_288);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x65c49a);
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_270 = *plVar14;
            lStack_268 = plVar9[3];
            local_280 = &local_270;
          }
          else {
            local_270 = *plVar14;
            local_280 = (long *)*plVar9;
          }
          local_278 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_280);
          pTVar10 = local_2b8;
          local_2b0 = &local_2a0;
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_2a0 = *plVar14;
            lStack_298 = plVar9[3];
          }
          else {
            local_2a0 = *plVar14;
            local_2b0 = (long *)*plVar9;
          }
          local_2a8 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)local_2b8,pCVar1->m_testCtx,(char *)name,(char *)local_2b0);
          ((TestNode *)&pTVar10->_vptr_TestNode)->_vptr_TestNode =
               (_func_int **)&PTR__TestCase_00772800;
          ((TestNode *)&pTVar10[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
          if (local_2b0 != &local_2a0) {
            operator_delete(local_2b0,local_2a0 + 1);
          }
          this = (DrawCallBatchingTests *)local_258;
          if (local_280 != &local_270) {
            operator_delete(local_280,local_270 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if (local_2d8[0] != local_2c8) {
            operator_delete(local_2d8[0],local_2c8[0] + 1);
          }
          node = (TestNode *)operator_new(0x78);
          pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)node,pCVar1->m_testCtx,"1_attribute",
                     "Test draw call batching with 1 attribute.");
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
          node[1]._vptr_TestNode = (_func_int **)pCVar1;
          node_00 = (TestNode *)operator_new(0x78);
          pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)node_00,pCVar1->m_testCtx,"8_attributes",
                     "Test draw call batching with 8 attributes.");
          pTVar10 = local_2b8;
          node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
          node_00[1]._vptr_TestNode = (_func_int **)pCVar1;
          tcu::TestNode::addChild(local_2b8,node);
          tcu::TestNode::addChild(pTVar10,node_00);
          tcu::TestNode::addChild(local_260,pTVar10);
          lVar20 = 0;
          local_200 = node_00;
          local_1f8 = node;
          do {
            local_210 = (ulong)(uint)(&DAT_0065c390)[lVar20];
            local_218 = (ulong)(uint)(&DAT_0065c3b0)[lVar20];
            iVar7 = (&DAT_0065c3b0)[lVar20] + (&DAT_0065c390)[lVar20];
            local_250 = local_1f8;
            if ((iVar7 != 1) && (local_250 = local_200, iVar7 != 8)) {
              local_250 = (TestNode *)0x0;
            }
            bVar22 = lVar20 == 4;
            bVar23 = lVar20 == 1;
            local_1d8 = "buffers_";
            local_1e8 = "buffers_";
            if (bVar23) {
              local_1e8 = "buffer_";
            }
            bVar24 = lVar20 == 3;
            bVar25 = lVar20 == 0;
            if (bVar25) {
              local_1d8 = "buffer_";
            }
            local_1e0 = 8 - (ulong)bVar25;
            local_1f0 = 8 - (ulong)bVar23;
            pcVar18 = (char *)CONCAT71((int7)((ulong)local_1f0 >> 8),1);
            lVar13 = 0;
            local_220 = lVar20;
            do {
              local_23c = (uint)pcVar18;
              local_284 = (&DAT_0065c368)[lVar13];
              uVar8 = 0;
              pcVar18 = "r";
              do {
                local_238 = (uint)pcVar18;
                local_2b8 = (TestNode *)CONCAT44(local_2b8._4_4_,uVar8);
                bVar2 = false;
                bVar4 = true;
                do {
                  bVar17 = bVar4;
                  if (((bVar22 || bVar23) & bVar2) == 0 && ((bVar24 || bVar25) & (byte)uVar8) == 0)
                  {
                    pTVar10 = (TestNode *)operator_new(0x1d8);
                    local_1d0 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                    iVar7 = (int)lVar20;
                    if ((iVar7 != 1) && (iVar7 != 4)) {
                      poVar11 = (ostream *)
                                std::ostream::operator<<((ostringstream *)&local_1a8,(int)local_210)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_static_",8);
                    }
                    if (bVar2) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1a8,local_1d8,local_1e0);
                    }
                    if ((iVar7 != 0) && (iVar7 != 3)) {
                      poVar11 = (ostream *)
                                std::ostream::operator<<((ostringstream *)&local_1a8,(int)local_218)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_dynamic_",9);
                    }
                    if (((ulong)local_2b8 & 1) != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1a8,local_1e8,local_1f0);
                    }
                    poVar11 = (ostream *)
                              std::ostream::operator<<((ostringstream *)&local_1a8,local_284);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_triangles",10);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                    std::ios_base::~ios_base(local_138);
                    plVar9 = local_2f8;
                    local_2d8[0] = (long *)0x44;
                    local_1a8 = &local_198;
                    pplVar12 = (long **)std::__cxx11::string::_M_create
                                                  ((ulong *)&local_1a8,(ulong)local_2d8);
                    plVar14 = local_2d8[0];
                    local_198 = local_2d8[0];
                    local_1a8 = pplVar12;
                    memcpy(pplVar12,
                           "Test performance of batched rendering against non-batched rendering.",
                           0x44);
                    pCVar1 = local_1d0;
                    local_1a0 = plVar14;
                    *(undefined1 *)((long)pplVar12 + (long)plVar14) = 0;
                    tcu::TestCase::TestCase
                              ((TestCase *)pTVar10,local_1d0->m_testCtx,NODETYPE_PERFORMANCE,
                               (char *)plVar9,(char *)local_1a8);
                    pTVar10->_vptr_TestNode = (_func_int **)&PTR__DrawCallBatchingTest_00780a00;
                    *(undefined4 *)&pTVar10[1]._vptr_TestNode = 0;
                    pTVar10[1].m_testCtx = (TestContext *)pCVar1->m_renderCtx;
                    seed = deStringHash((char *)plVar9);
                    deRandom_init((deRandom *)&pTVar10[1].m_name,seed);
                    pTVar10[1].m_name.field_2._M_allocated_capacity = 0x2200000000;
                    *(undefined4 *)((long)&pTVar10[1].m_name.field_2 + 8) = 0x22;
                    pTVar10[1].m_name.field_2._M_local_buf[0xc] = bVar2;
                    *(int *)&pTVar10[1].m_description._M_dataplus._M_p = (int)local_210;
                    *(char *)((long)&pTVar10[1].m_description._M_dataplus._M_p + 4) =
                         (char)local_2b8;
                    *(int *)&pTVar10[1].m_description._M_string_length = (int)local_218;
                    *(int *)((long)&pTVar10[1].m_description._M_string_length + 4) = local_284;
                    *(int *)&pTVar10[1].m_description.field_2 = local_288;
                    pTVar10[1].m_description.field_2._M_local_buf[4] = (char)local_228;
                    pTVar10[1].m_description.field_2._M_local_buf[5] = (char)local_28c;
                    pTVar10[1].m_description.field_2._M_local_buf[6] = (char)local_234;
                    *(undefined8 *)((long)&pTVar10[1].m_description.field_2 + 8) = 0;
                    *(undefined8 *)&pTVar10[1].m_nodeType = 0;
                    pTVar10[1].m_children.
                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    pTVar10[1].m_children.
                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    pTVar10[1].m_children.
                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    pTVar10[2]._vptr_TestNode = (_func_int **)0x0;
                    pTVar10[2].m_testCtx = (TestContext *)0x0;
                    pTVar10[2].m_name._M_dataplus._M_p = (pointer)0x0;
                    pTVar10[2].m_name._M_string_length = 0;
                    pTVar10[2].m_name.field_2._M_allocated_capacity = 0;
                    *(undefined8 *)((long)&pTVar10[2].m_name.field_2 + 4) = 0;
                    *(undefined8 *)((long)&pTVar10[2].m_name.field_2 + 0xc) = 0;
                    memset(&pTVar10[2].m_description._M_string_length,0,0xc0);
                    tcu::TestNode::addChild(local_250,pTVar10);
                    if (local_1a8 != &local_198) {
                      operator_delete(local_1a8,(long)local_198 + 1);
                    }
                    lVar20 = local_220;
                    this = (DrawCallBatchingTests *)local_258;
                    if (local_2f8 != &local_2e8) {
                      operator_delete(local_2f8,local_2e8 + 1);
                    }
                  }
                  bVar2 = true;
                  bVar4 = false;
                } while (bVar17);
                uVar8 = 1;
                pcVar18 = (char *)0x0;
              } while ((local_238 & 1) != 0);
              lVar13 = 1;
            } while ((local_23c & 1) != 0);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 5);
          uVar15 = 0;
        } while ((local_240 & 1) != 0);
        uVar21 = CONCAT71((int7)((ulong)&local_198 >> 8),1);
        uVar3 = local_290 & 1;
        local_290 = 0;
        uVar16 = (ulong)local_244;
        uVar19 = (ulong)local_28c;
        in_R10 = (ulong)local_248;
      } while (uVar3 != 0);
      iVar7 = (int)lVar13;
      uVar19 = CONCAT71((int7)(uVar19 >> 8),1);
      uVar21 = in_R10 & 1;
      in_R10 = 0;
    } while (uVar21 != 0);
    local_228 = CONCAT71((int7)(local_228 >> 8),1);
    uVar19 = uVar16 & 1;
    uVar16 = 0;
    if (uVar19 == 0) {
      return iVar7;
    }
  } while( true );
}

Assistant:

void DrawCallBatchingTests::init (void)
{
	int drawCallCounts[] = {
		10, 100
	};

	int triangleCounts[] = {
		2, 10
	};

	int staticAttributeCounts[] = {
		1, 0, 4, 8, 0
	};

	int dynamicAttributeCounts[] = {
		0, 1, 4, 0, 8
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(staticAttributeCounts) == DE_LENGTH_OF_ARRAY(dynamicAttributeCounts));

	for (int drawType = 0; drawType < 2; drawType++)
	{
		bool drawElements = (drawType == 1);

		for (int indexBufferNdx = 0; indexBufferNdx < 2; indexBufferNdx++)
		{
			bool useIndexBuffer = (indexBufferNdx == 1);

			if (useIndexBuffer && !drawElements)
				continue;

			for (int dynamicIndexNdx = 0; dynamicIndexNdx < 2; dynamicIndexNdx++)
			{
				bool dynamicIndices = (dynamicIndexNdx == 1);

				if (dynamicIndices && !drawElements)
					continue;

				if (dynamicIndices && !useIndexBuffer)
					continue;

				TestCaseGroup* drawTypeGroup = new TestCaseGroup(m_context, (string(dynamicIndices ? "dynamic_" : "") + (useIndexBuffer ? "buffer_" : "" ) + (drawElements ? "draw_elements" : "draw_arrays")).c_str(), (string("Test batched rendering with ") + (drawElements ? "draw_elements" : "draw_arrays")).c_str());

				addChild(drawTypeGroup);

				for (int drawCallCountNdx = 0; drawCallCountNdx < DE_LENGTH_OF_ARRAY(drawCallCounts); drawCallCountNdx++)
				{
					int drawCallCount = drawCallCounts[drawCallCountNdx];

					TestCaseGroup*	callCountGroup			= new TestCaseGroup(m_context, (de::toString(drawCallCount) + (drawCallCount == 1 ? "_draw" : "_draws")).c_str(), ("Test batched rendering performance with " + de::toString(drawCallCount) + " draw calls.").c_str());
					TestCaseGroup*	attributeCount1Group	= new TestCaseGroup(m_context, "1_attribute", "Test draw call batching with 1 attribute.");
					TestCaseGroup*	attributeCount8Group	= new TestCaseGroup(m_context, "8_attributes", "Test draw call batching with 8 attributes.");

					callCountGroup->addChild(attributeCount1Group);
					callCountGroup->addChild(attributeCount8Group);

					drawTypeGroup->addChild(callCountGroup);

					for (int attributeCountNdx = 0; attributeCountNdx < DE_LENGTH_OF_ARRAY(dynamicAttributeCounts); attributeCountNdx++)
					{
						TestCaseGroup*	attributeCountGroup		= NULL;

						int				staticAttributeCount	= staticAttributeCounts[attributeCountNdx];
						int				dynamicAttributeCount	= dynamicAttributeCounts[attributeCountNdx];

						if (staticAttributeCount + dynamicAttributeCount == 1)
							attributeCountGroup = attributeCount1Group;
						else if (staticAttributeCount + dynamicAttributeCount == 8)
							attributeCountGroup = attributeCount8Group;
						else
							DE_ASSERT(false);

						for (int triangleCountNdx = 0; triangleCountNdx < DE_LENGTH_OF_ARRAY(triangleCounts); triangleCountNdx++)
						{
							int triangleCount = triangleCounts[triangleCountNdx];

							for (int dynamicBufferNdx = 0; dynamicBufferNdx < 2; dynamicBufferNdx++)
							{
								bool useDynamicBuffer = (dynamicBufferNdx != 0);

								for (int staticBufferNdx = 0; staticBufferNdx < 2; staticBufferNdx++)
								{
									bool useStaticBuffer = (staticBufferNdx != 0);

									DrawCallBatchingTest::TestSpec spec;

									spec.useStaticBuffer		= useStaticBuffer;
									spec.staticAttributeCount	= staticAttributeCount;

									spec.useDynamicBuffer		= useDynamicBuffer;
									spec.dynamicAttributeCount	= dynamicAttributeCount;

									spec.drawCallCount			= drawCallCount;
									spec.triangleCount			= triangleCount;

									spec.useDrawElements		= drawElements;
									spec.useIndexBuffer			= useIndexBuffer;
									spec.dynamicIndices			= dynamicIndices;

									if (spec.useStaticBuffer && spec.staticAttributeCount == 0)
										continue;

									if (spec.useDynamicBuffer && spec.dynamicAttributeCount == 0)
										continue;

									attributeCountGroup->addChild(new DrawCallBatchingTest(m_context, specToName(spec).c_str(), specToDescrpition(spec).c_str(), spec));
								}
							}
						}
					}
				}
			}
		}
	}
}